

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZZ.hpp
# Opt level: O2

RotationZZ<std::complex<double>_> *
qclab::qgates::operator/
          (RotationZZ<std::complex<double>_> *__return_storage_ptr__,
          RotationZZ<std::complex<double>_> *lhs,RotationZZ<std::complex<double>_> *rhs)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  double dVar4;
  int iVar5;
  
  iVar1 = (lhs->super_QRotationGate2<std::complex<double>_>).qubits_._M_elems[0];
  iVar5 = (*(rhs->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(rhs);
  if (iVar1 == iVar5) {
    RotationZZ<std::complex<double>_>::operator/=(lhs,rhs);
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).super_QAdjustable.fixed_ =
         (lhs->super_QRotationGate2<std::complex<double>_>).super_QAdjustable.fixed_;
    uVar2 = *(undefined8 *)(lhs->super_QRotationGate2<std::complex<double>_>).qubits_._M_elems;
    uVar3 = *(undefined8 *)&(lhs->super_QRotationGate2<std::complex<double>_>).field_0x14;
    dVar4 = (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.sin_;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.cos_ =
         (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.cos_;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.sin_ =
         dVar4;
    *(undefined8 *)
     (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).qubits_._M_elems = uVar2;
    *(undefined8 *)&(__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).field_0x14
         = uVar3;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).
    super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_004cf3f0;
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationZZ.hpp"
                ,0xd2,"RotationZZ<T> qclab::qgates::operator/(RotationZZ<T>, const RotationZZ<T> &)"
               );
}

Assistant:

RotationZZ< T > operator/( RotationZZ< T > lhs ,
                                         const RotationZZ< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs /= rhs ;
          return lhs ;
        }